

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetSetter
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  uint32 local_4c;
  ScriptContext *pSStack_48;
  uint32 index;
  ScriptContext *scriptContext;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  pSStack_48 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_48,setterValue_local._4_4_,&local_4c);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<int>::GetSetter
                   (&this->super_DictionaryTypeHandlerBase<int>,pDStack_20,setterValue_local._4_4_,
                    &info_local->m_instance,(PropertyValueInfo *)requestContext_local,scriptContext)
    ;
  }
  else {
    PropertyValueInfo::SetNoCache
              ((PropertyValueInfo *)requestContext_local,&pDStack_20->super_RecyclableObject);
    this_local._4_4_ = GetItemSetter(this,pDStack_20,local_4c,&info_local->m_instance,scriptContext)
    ;
  }
  return this_local._4_4_;
}

Assistant:

DescriptorFlags ES5ArrayTypeHandlerBase<T>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            PropertyValueInfo::SetNoCache(info, instance);
            return ES5ArrayTypeHandlerBase<T>::GetItemSetter(instance, index, setterValue, requestContext);
        }

        return __super::GetSetter(instance, propertyId, setterValue, info, requestContext);
    }